

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sol_check.h
# Opt level: O1

void __thiscall
mp::
SolutionChecker<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::GenConViol(SolutionChecker<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
             *this,map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::array<mp::ViolSummary,_3UL>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::array<mp::ViolSummary,_3UL>_>_>_>
                   *cvmap,MemoryWriter *wrt,int alg_log)

{
  _Rb_tree_node_base *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  int iVar4;
  long *plVar5;
  _Base_ptr p_Var6;
  long *plVar7;
  size_type *psVar8;
  string local_e8;
  int local_c4;
  long *local_c0;
  long local_b8;
  long local_b0;
  long lStack_a8;
  MemoryWriter *local_a0;
  long *local_98 [2];
  long local_88 [2];
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  long *local_58 [2];
  long local_48 [2];
  _Rb_tree_node_base *local_38;
  
  if ((cvmap->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0) {
    p_Var6 = (cvmap->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    local_38 = &(cvmap->_M_t)._M_impl.super__Rb_tree_header._M_header;
    if (p_Var6 != local_38) {
      paVar2 = &local_e8.field_2;
      local_c4 = alg_log;
      local_a0 = wrt;
      do {
        p_Var1 = p_Var6 + 1;
        iVar4 = std::__cxx11::string::compare((ulong)p_Var1,0,(char *)0x8);
        if (iVar4 == 0) {
          local_e8._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_e8,"aux algebr con(s)","");
LAB_00168a2e:
          bVar3 = false;
        }
        else {
          iVar4 = std::__cxx11::string::compare((ulong)p_Var1,0,(char *)0x4);
          if (iVar4 == 0) {
            local_e8._M_dataplus._M_p = (pointer)paVar2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_e8,"algebraic con(s)","");
            goto LAB_00168a2e;
          }
          iVar4 = std::__cxx11::string::compare((ulong)p_Var1,0,(char *)0x9);
          if (iVar4 == 0) {
            local_e8._M_dataplus._M_p = (pointer)paVar2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_e8,"aux quadr con(s)","");
            goto LAB_00168a2e;
          }
          iVar4 = std::__cxx11::string::compare((ulong)p_Var1,0,(char *)0x5);
          if (iVar4 == 0) {
            local_e8._M_dataplus._M_p = (pointer)paVar2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_e8,"quadratic con(s)","");
            goto LAB_00168a2e;
          }
          local_58[0] = local_48;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_58,*(long *)(p_Var6 + 1),
                     (long)&(p_Var6[1]._M_parent)->_M_color + *(long *)(p_Var6 + 1));
          plVar5 = (long *)std::__cxx11::string::replace((ulong)local_58,0,(char *)0x0,0x49dade);
          local_78 = &local_68;
          plVar7 = plVar5 + 2;
          if ((long *)*plVar5 == plVar7) {
            local_68 = *plVar7;
            lStack_60 = plVar5[3];
          }
          else {
            local_68 = *plVar7;
            local_78 = (long *)*plVar5;
          }
          local_70 = plVar5[1];
          *plVar5 = (long)plVar7;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_78);
          psVar8 = (size_type *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar8) {
            local_e8.field_2._M_allocated_capacity = *psVar8;
            local_e8.field_2._8_8_ = plVar5[3];
            local_e8._M_dataplus._M_p = (pointer)paVar2;
          }
          else {
            local_e8.field_2._M_allocated_capacity = *psVar8;
            local_e8._M_dataplus._M_p = (pointer)*plVar5;
          }
          local_e8._M_string_length = plVar5[1];
          *plVar5 = (long)psVar8;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          bVar3 = true;
        }
        Gen1Viol(this,(ViolSummary *)(p_Var6 + 2),local_a0,local_c4 == 0,&local_e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != paVar2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
        if (bVar3) {
          if (local_78 != &local_68) {
            operator_delete(local_78,local_68 + 1);
          }
          if (local_58[0] != local_48) {
            operator_delete(local_58[0],local_48[0] + 1);
          }
        }
        local_98[0] = local_88;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_98,*(long *)(p_Var6 + 1),
                   (long)&(p_Var6[1]._M_parent)->_M_color + *(long *)(p_Var6 + 1));
        plVar5 = (long *)std::__cxx11::string::replace((ulong)local_98,0,(char *)0x0,0x49daca);
        local_c0 = &local_b0;
        plVar7 = plVar5 + 2;
        if ((long *)*plVar5 == plVar7) {
          local_b0 = *plVar7;
          lStack_a8 = plVar5[3];
        }
        else {
          local_b0 = *plVar7;
          local_c0 = (long *)*plVar5;
        }
        local_b8 = plVar5[1];
        *plVar5 = (long)plVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_c0);
        psVar8 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_e8.field_2._M_allocated_capacity = *psVar8;
          local_e8.field_2._8_8_ = plVar5[3];
          local_e8._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_e8.field_2._M_allocated_capacity = *psVar8;
          local_e8._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_e8._M_string_length = plVar5[1];
        *plVar5 = (long)psVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        Gen1Viol(this,(ViolSummary *)&p_Var6[3]._M_parent,local_a0,local_c4 == 0,&local_e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != paVar2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
        if (local_c0 != &local_b0) {
          operator_delete(local_c0,local_b0 + 1);
        }
        if (local_98[0] != local_88) {
          operator_delete(local_98[0],local_88[0] + 1);
        }
        local_98[0] = local_88;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_98,*(long *)(p_Var6 + 1),
                   (long)&(p_Var6[1]._M_parent)->_M_color + *(long *)(p_Var6 + 1));
        plVar5 = (long *)std::__cxx11::string::replace((ulong)local_98,0,(char *)0x0,0x49dad8);
        local_c0 = &local_b0;
        plVar7 = plVar5 + 2;
        if ((long *)*plVar5 == plVar7) {
          local_b0 = *plVar7;
          lStack_a8 = plVar5[3];
        }
        else {
          local_b0 = *plVar7;
          local_c0 = (long *)*plVar5;
        }
        local_b8 = plVar5[1];
        *plVar5 = (long)plVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_c0);
        psVar8 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_e8.field_2._M_allocated_capacity = *psVar8;
          local_e8.field_2._8_8_ = plVar5[3];
          local_e8._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_e8.field_2._M_allocated_capacity = *psVar8;
          local_e8._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_e8._M_string_length = plVar5[1];
        *plVar5 = (long)psVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        Gen1Viol(this,(ViolSummary *)&p_Var6[4]._M_left,local_a0,local_c4 == 0,&local_e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != paVar2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
        if (local_c0 != &local_b0) {
          operator_delete(local_c0,local_b0 + 1);
        }
        if (local_98[0] != local_88) {
          operator_delete(local_98[0],local_88[0] + 1);
        }
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
      } while (p_Var6 != local_38);
    }
  }
  return;
}

Assistant:

void GenConViol(
      const std::map< std::string, ViolSummArray<3> >& cvmap,
      fmt::MemoryWriter& wrt, int alg_log) {
    if (cvmap.size()) {
      for (const auto& cva: cvmap) {
        Gen1Viol(cva.second.at(0), wrt, !alg_log,
                 0==cva.first.compare(0, 8, "_linfunc")
                 ? "aux algebr con(s)"
                 : 0==cva.first.compare(0, 4, "_lin")
                   ? "algebraic con(s)"
                 : 0==cva.first.compare(0, 9, "_quadfunc")
                   ? "aux quadr con(s)"
                 : 0==cva.first.compare(0, 5, "_quad")
                   ? "quadratic con(s)"
                 : "expr '"
                 + std::string(cva.first) + "'");
        Gen1Viol(cva.second.at(1), wrt, !alg_log,
                 "interm expr '"
                 + std::string(cva.first) + "'");
        Gen1Viol(cva.second.at(2), wrt, !alg_log,
                 "final expr '"
                 + std::string(cva.first) + "'");
      }
    }
  }